

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O2

uchar * __thiscall CJSON::GetValue<unsigned_char*>(CJSON *this,string *Name,size_t *Size)

{
  bool bVar1;
  iterator iVar2;
  uchar *puVar3;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this,Name);
  if ((_Rb_tree_header *)iVar2._M_node != &(this->m_Values)._M_t._M_impl.super__Rb_tree_header) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (iVar2._M_node + 2),"null");
    if (!bVar1) {
      puVar3 = ParseArray<unsigned_char_*,_nullptr>(this,(string *)(iVar2._M_node + 2),Size);
      return puVar3;
    }
  }
  *Size = 0;
  return (uchar *)0x0;
}

Assistant:

T GetValue(const std::string &Name, size_t &Size)
        {
            std::map<std::string, std::string>::iterator IT = m_Values.find(Name);
            if(IT == m_Values.end())
            {
                Size = 0;
                return nullptr;
            }

            if(IT->second == "null")
            {
                Size = 0;
                return AddNullObj<T>();
            }

            return ParseArray<T>(IT->second, Size);
        }